

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O3

void get_msurf_descriptor_precompute_gauss_array(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  interest_point *piVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int col;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int row;
  int iVar16;
  long lVar17;
  int iVar18;
  float *pfVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int scale;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  float fVar41;
  undefined1 auVar42 [64];
  float fVar43;
  float fVar44;
  uint local_fc;
  int local_e8;
  float local_c8;
  float local_c4;
  ulong local_c0;
  integral_image *local_b8;
  long local_b0;
  float *local_a8;
  long local_a0;
  float *local_98;
  ulong local_90;
  ulong local_88;
  float local_80;
  float local_7c;
  undefined1 local_78 [16];
  ulong local_68;
  interest_point *local_60;
  ulong local_58;
  long local_50;
  undefined1 local_48 [16];
  
  auVar36._8_4_ = 0x3effffff;
  auVar36._0_8_ = 0x3effffff3effffff;
  auVar36._12_4_ = 0x3effffff;
  auVar34._8_4_ = 0x80000000;
  auVar34._0_8_ = 0x8000000080000000;
  auVar34._12_4_ = 0x80000000;
  fVar35 = ipoint->scale;
  local_48 = ZEXT416((uint)fVar35);
  auVar23 = vpternlogd_avx512vl(auVar36,local_48,auVar34,0xf8);
  auVar23 = ZEXT416((uint)(fVar35 + auVar23._0_4_));
  auVar23 = vroundss_avx(auVar23,auVar23,0xb);
  scale = (int)auVar23._0_4_;
  fVar44 = -0.08 / (fVar35 * fVar35);
  auVar23 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)ipoint->x),auVar34,0xf8);
  auVar26._0_8_ = (double)fVar35;
  auVar26._8_8_ = 0;
  auVar23 = ZEXT416((uint)(ipoint->x + auVar23._0_4_));
  auVar23 = vroundss_avx(auVar23,auVar23,0xb);
  auVar24._0_8_ = (double)auVar23._0_4_;
  auVar24._8_8_ = auVar23._8_8_;
  auVar23 = vfmadd231sd_fma(auVar24,auVar26,ZEXT816(0x3fe0000000000000));
  local_7c = (float)auVar23._0_8_;
  auVar23 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)ipoint->y),auVar34,0xf8);
  auVar23 = ZEXT416((uint)(ipoint->y + auVar23._0_4_));
  auVar23 = vroundss_avx(auVar23,auVar23,0xb);
  auVar25._0_8_ = (double)auVar23._0_4_;
  auVar25._8_8_ = auVar23._8_8_;
  auVar23 = vfmadd231sd_fma(auVar25,auVar26,ZEXT816(0x3fe0000000000000));
  local_80 = (float)auVar23._0_8_;
  auVar23 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)(fVar35 * 0.5)),auVar34,0xf8);
  auVar23 = ZEXT416((uint)(fVar35 * 0.5 + auVar23._0_4_));
  auVar23 = vroundss_avx(auVar23,auVar23,0xb);
  auVar24 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)(fVar35 * 1.5)),auVar34,0xf8);
  auVar24 = ZEXT416((uint)(fVar35 * 1.5 + auVar24._0_4_));
  auVar24 = vroundss_avx(auVar24,auVar24,0xb);
  auVar25 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)(fVar35 * 2.5)),auVar34,0xf8);
  auVar25 = ZEXT416((uint)(fVar35 * 2.5 + auVar25._0_4_));
  auVar25 = vroundss_avx(auVar25,auVar25,0xb);
  auVar26 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)(fVar35 * 3.5)),auVar34,0xf8);
  auVar26 = ZEXT416((uint)(fVar35 * 3.5 + auVar26._0_4_));
  auVar26 = vroundss_avx(auVar26,auVar26,0xb);
  auVar27 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)(fVar35 * 4.5)),auVar34,0xf8);
  auVar27 = ZEXT416((uint)(fVar35 * 4.5 + auVar27._0_4_));
  auVar27 = vroundss_avx(auVar27,auVar27,0xb);
  auVar28 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)(fVar35 * 5.5)),auVar34,0xf8);
  auVar28 = ZEXT416((uint)(auVar28._0_4_ + fVar35 * 5.5));
  auVar28 = vroundss_avx(auVar28,auVar28,0xb);
  auVar42 = ZEXT1664(auVar28);
  auVar29 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)(fVar35 * 6.5)),auVar34,0xf8);
  auVar29 = ZEXT416((uint)(fVar35 * 6.5 + auVar29._0_4_));
  auVar29 = vroundss_avx(auVar29,auVar29,0xb);
  auVar30 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)(fVar35 * 7.5)),auVar34,0xf8);
  auVar30 = ZEXT416((uint)(fVar35 * 7.5 + auVar30._0_4_));
  auVar30 = vroundss_avx(auVar30,auVar30,0xb);
  auVar31 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)(fVar35 * 8.5)),auVar34,0xf8);
  auVar31 = ZEXT416((uint)(fVar35 * 8.5 + auVar31._0_4_));
  auVar31 = vroundss_avx(auVar31,auVar31,0xb);
  auVar32 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)(fVar35 * 9.5)),auVar34,0xf8);
  auVar32 = ZEXT416((uint)(fVar35 * 9.5 + auVar32._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  auVar33 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)(fVar35 * 10.5)),auVar34,0xf8);
  auVar33 = ZEXT416((uint)(fVar35 * 10.5 + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  auVar34 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)(fVar35 * 11.5)),auVar34,0xf8);
  fVar38 = auVar25._0_4_;
  fVar2 = fVar38 + auVar24._0_4_;
  fVar41 = fVar38 - auVar23._0_4_;
  local_b0 = CONCAT44(local_b0._4_4_,fVar38 + auVar23._0_4_);
  auVar23 = ZEXT416((uint)(fVar35 * 11.5 + auVar34._0_4_));
  auVar23 = vroundss_avx(auVar23,auVar23,0xb);
  local_a0 = CONCAT44(local_a0._4_4_,fVar38 - auVar26._0_4_);
  fVar35 = fVar38 - auVar28._0_4_;
  local_a8 = (float *)CONCAT44(local_a8._4_4_,fVar38 - auVar24._0_4_);
  fVar43 = auVar30._0_4_;
  local_98 = (float *)CONCAT44(local_98._4_4_,fVar38 - auVar27._0_4_);
  fVar3 = fVar43 - auVar27._0_4_;
  local_78._0_4_ = fVar43 - auVar23._0_4_;
  local_88 = CONCAT44(local_88._4_4_,fVar43 - auVar26._0_4_);
  fVar4 = fVar43 - auVar28._0_4_;
  fVar5 = fVar43 - auVar29._0_4_;
  local_90 = CONCAT44(local_90._4_4_,fVar38 - auVar29._0_4_);
  fVar38 = fVar43 - auVar32._0_4_;
  local_c0 = CONCAT44(local_c0._4_4_,fVar43 - auVar31._0_4_);
  fVar43 = fVar43 - auVar33._0_4_;
  local_b8 = iimage;
  gauss_s1_c0[0] = expf(fVar44 * fVar2 * fVar2);
  gauss_s1_c0[1] = expf((float)local_b0 * (float)local_b0 * fVar44);
  gauss_s1_c0[2] = expf(fVar41 * fVar41 * fVar44);
  gauss_s1_c0[3] = expf(local_a8._0_4_ * local_a8._0_4_ * fVar44);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf((float)local_a0 * (float)local_a0 * fVar44);
  gauss_s1_c0[6] = expf(local_98._0_4_ * local_98._0_4_ * fVar44);
  gauss_s1_c0[7] = expf(fVar35 * fVar35 * fVar44);
  gauss_s1_c0[8] = expf((float)local_90 * (float)local_90 * fVar44);
  gauss_s1_c1[0] = expf((float)local_88 * (float)local_88 * fVar44);
  gauss_s1_c1[1] = expf(fVar3 * fVar3 * fVar44);
  gauss_s1_c1[2] = expf(fVar4 * fVar4 * fVar44);
  gauss_s1_c1[3] = expf(fVar5 * fVar5 * fVar44);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf((float)local_c0 * (float)local_c0 * fVar44);
  gauss_s1_c1[6] = expf(fVar38 * fVar38 * fVar44);
  gauss_s1_c1[7] = expf(fVar43 * fVar43 * fVar44);
  gauss_s1_c1[8] = expf((float)local_78._0_4_ * (float)local_78._0_4_ * fVar44);
  local_c0 = (ulong)(uint)(scale * 2);
  uVar14 = 0xfffffff8;
  fVar35 = 0.0;
  lVar17 = 0;
  iVar13 = 0;
  local_e8 = 0;
  local_60 = ipoint;
  do {
    uVar12 = (uint)uVar14;
    pfVar19 = gauss_s1_c0;
    lVar17 = (long)(int)lVar17;
    local_fc = 9;
    if (uVar12 == 7) {
      pfVar19 = gauss_s1_c1;
    }
    if (uVar12 == 0xfffffff8) {
      pfVar19 = gauss_s1_c1;
    }
    lVar15 = (long)local_e8;
    local_a8 = (float *)((long)pfVar19 + (ulong)(uint)((int)(uVar14 >> 0x1f) << 5));
    local_e8 = local_e8 + 4;
    uVar11 = 0xfffffff8;
    local_68 = uVar14;
    do {
      iVar10 = (int)uVar11;
      local_98 = gauss_s1_c0;
      auVar40 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar14 = (ulong)((uint)(uVar11 >> 0x1c) & 8);
      if (iVar10 == 7) {
        local_98 = gauss_s1_c1;
      }
      if (iVar10 == -8) {
        local_98 = gauss_s1_c1;
      }
      local_a0 = (ulong)(-1 < iVar10) * 2 + -1;
      uVar8 = iVar10 + 8;
      local_b0 = lVar17;
      local_58 = uVar11;
      local_50 = lVar15;
      do {
        local_90 = (ulong)uVar8;
        iVar22 = -0xc;
        auVar23._0_4_ = (float)(int)(uVar8 - 0xc);
        auVar23._4_12_ = auVar42._4_12_;
        auVar23 = vfmadd132ss_fma(auVar23,ZEXT416((uint)local_80),ZEXT416((uint)local_48._0_4_));
        auVar28._8_4_ = 0x3effffff;
        auVar28._0_8_ = 0x3effffff3effffff;
        auVar28._12_4_ = 0x3effffff;
        auVar27._8_4_ = 0x80000000;
        auVar27._0_8_ = 0x8000000080000000;
        auVar27._12_4_ = 0x80000000;
        auVar24 = vpternlogd_avx512vl(auVar28,auVar23,auVar27,0xf8);
        fVar2 = local_98[uVar14];
        auVar23 = ZEXT416((uint)(auVar23._0_4_ + auVar24._0_4_));
        auVar23 = vroundss_avx(auVar23,auVar23,0xb);
        row = (int)auVar23._0_4_ - scale;
        iVar10 = (int)local_c0;
        pfVar19 = local_a8;
        local_88 = uVar14;
        do {
          local_c4 = 0.0;
          local_c8 = 0.0;
          auVar30._0_4_ = (float)(iVar13 + iVar22);
          auVar30._4_12_ = auVar42._4_12_;
          auVar24 = vfmadd132ss_fma(auVar30,ZEXT416((uint)local_7c),ZEXT416((uint)local_48._0_4_));
          auVar31._8_4_ = 0x3effffff;
          auVar31._0_8_ = 0x3effffff3effffff;
          auVar31._12_4_ = 0x3effffff;
          auVar29._8_4_ = 0x80000000;
          auVar29._0_8_ = 0x8000000080000000;
          auVar29._12_4_ = 0x80000000;
          auVar25 = vpternlogd_avx512vl(auVar31,auVar24,auVar29,0xf8);
          fVar41 = fVar2 * *pfVar19;
          auVar24 = ZEXT416((uint)(auVar24._0_4_ + auVar25._0_4_));
          auVar24 = vroundss_avx(auVar24,auVar24,0xb);
          iVar9 = (int)auVar24._0_4_;
          col = iVar9 - scale;
          if ((((row < 1) || (col < 1)) || (local_b8->height < row + iVar10)) ||
             (iVar16 = col + (int)local_c0, local_b8->width < iVar16)) {
            local_78 = ZEXT416((uint)fVar41);
            haarXY(local_b8,row,col,scale,&local_c4,&local_c8);
            auVar24 = vinsertps_avx(ZEXT416((uint)local_c8),ZEXT416((uint)local_c4),0x10);
            fVar41 = (float)local_78._0_4_;
          }
          else {
            pfVar1 = local_b8->data;
            iVar18 = local_b8->data_width;
            iVar20 = iVar18 * (row + -1);
            iVar21 = iVar18 * ((int)auVar23._0_4_ + -1);
            iVar18 = iVar18 * (row + -1 + iVar10);
            auVar24 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar20 + -1 + iVar9] -
                                                    pfVar1[iVar18 + -1 + iVar9])),
                                      SUB6416(ZEXT464(0x40000000),0),
                                      ZEXT416((uint)(pfVar1[iVar18 + -1 + iVar16] -
                                                    pfVar1[iVar20 + -1 + col])));
            auVar25 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar21 + -1 + col] -
                                                    pfVar1[iVar21 + -1 + iVar16])),
                                      SUB6416(ZEXT464(0x40000000),0),
                                      ZEXT416((uint)(pfVar1[iVar18 + -1 + iVar16] -
                                                    pfVar1[iVar20 + -1 + col])));
            auVar24 = vinsertps_avx(ZEXT416((uint)(auVar25._0_4_ -
                                                  (pfVar1[iVar18 + -1 + col] -
                                                  pfVar1[iVar20 + -1 + iVar16]))),
                                    ZEXT416((uint)((pfVar1[iVar18 + -1 + col] -
                                                   pfVar1[iVar20 + -1 + iVar16]) + auVar24._0_4_)),
                                    0x10);
          }
          piVar7 = local_60;
          pfVar19 = pfVar19 + (ulong)(~uVar12 >> 0x1f) * 2 + -1;
          iVar22 = iVar22 + 1;
          auVar33._0_4_ = fVar41 * auVar24._0_4_;
          auVar33._4_4_ = fVar41 * auVar24._4_4_;
          auVar33._8_4_ = fVar41 * auVar24._8_4_;
          auVar33._12_4_ = fVar41 * auVar24._12_4_;
          auVar32._8_4_ = 0x7fffffff;
          auVar32._0_8_ = 0x7fffffff7fffffff;
          auVar32._12_4_ = 0x7fffffff;
          auVar24 = vandps_avx512vl(auVar33,auVar32);
          auVar24 = vmovlhps_avx(auVar33,auVar24);
          auVar39._0_4_ = auVar40._0_4_ + auVar24._0_4_;
          auVar39._4_4_ = auVar40._4_4_ + auVar24._4_4_;
          auVar39._8_4_ = auVar40._8_4_ + auVar24._8_4_;
          auVar39._12_4_ = auVar40._12_4_ + auVar24._12_4_;
          auVar40 = ZEXT1664(auVar39);
        } while (iVar22 != -3);
        uVar14 = local_88 + local_a0;
        uVar8 = (int)local_90 + 1;
      } while (uVar8 != local_fc);
      local_fc = local_fc + 5;
      fVar2 = gauss_s2_arr[local_50];
      auVar6._4_4_ = fVar2;
      auVar6._0_4_ = fVar2;
      auVar6._8_4_ = fVar2;
      auVar6._12_4_ = fVar2;
      auVar25 = vmulps_avx512vl(auVar39,auVar6);
      lVar15 = local_50 + 1;
      uVar11 = (ulong)((int)local_58 + 5);
      auVar37._0_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar37._4_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar37._8_4_ = auVar25._8_4_ * auVar25._8_4_;
      auVar37._12_4_ = auVar25._12_4_ * auVar25._12_4_;
      auVar24 = vshufpd_avx(auVar25,auVar25,1);
      *(undefined1 (*) [16])(local_60->descriptor + local_b0) = auVar25;
      lVar17 = local_b0 + 4;
      auVar23 = vmovshdup_avx(auVar37);
      auVar23 = vfmadd231ss_fma(auVar23,auVar25,auVar25);
      auVar24 = vfmadd213ss_fma(auVar24,auVar24,auVar23);
      auVar23 = vshufps_avx(auVar25,auVar25,0xff);
      auVar23 = vfmadd213ss_fma(auVar23,auVar23,auVar24);
      fVar35 = fVar35 + auVar23._0_4_;
    } while (local_e8 != (int)lVar15);
    iVar13 = iVar13 + 5;
    uVar14 = (ulong)((int)local_68 + 5);
  } while ((int)local_68 < 3);
  if (fVar35 < 0.0) {
    fVar35 = sqrtf(fVar35);
  }
  else {
    auVar23 = vsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
    fVar35 = auVar23._0_4_;
  }
  lVar17 = 0;
  auVar42 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar35)));
  do {
    auVar40 = vmulps_avx512f(auVar42,*(undefined1 (*) [64])(piVar7->descriptor + lVar17));
    *(undefined1 (*) [64])(piVar7->descriptor + lVar17) = auVar40;
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_precompute_gauss_array(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - equal to get_msurf_descriptor_gauss_compute_once_case but with arrays insteat of case statements
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point

    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8); l < (j + 17); ++l, gauss_index_l+=gauss_index_l_inc) {

                int sample_y = (int) roundf(ipoint_y + (l-12) * scale);
                int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {

                    int sample_x = (int) roundf(ipoint_x + (k-12) * scale);
                    int sample_x_sub_int_scale = sample_x-int_scale;
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    /* Code pre optimization
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            //int xs = (int) roundf(ipoint_x + (i+0.5f) * scale);
            //int ys = (int) roundf(ipoint_y + (j+0.5f) * scale);

            int gauss_index_l = -4;
            for (int l = j-4; l < j + 5; ++l, ++gauss_index_l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                //float ys_sub_sample_y = (float) ys-sample_y;
                //float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                //Get y coords of sample point
                int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = -1;
                if (j == -8 ) {
                    gauss_s1_y = gauss_s1_c1[8-(gauss_index_l+4)];
                } else if (j == -3) {
                    gauss_s1_y = gauss_s1_c0[8-(gauss_index_l+4)];
                } else if (j == 2) {
                    gauss_s1_y = gauss_s1_c0[gauss_index_l+4];
                } else if (j == 7) {
                    gauss_s1_y = gauss_s1_c1[gauss_index_l+4];
                }

                int gauss_index_k = -4;
                for (int k = i-4; k < i + 5; ++k, ++gauss_index_k) {
                
                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    //float xs_sub_sample_x = (float) xs-sample_x;
                    //float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    //Get x coords of sample point
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    float gauss_s1_x = -1;
                    if (i == -8 ) {
                        gauss_s1_x = gauss_s1_c1[8-(gauss_index_k+4)];
                    } else if (i == -3) {
                        gauss_s1_x = gauss_s1_c0[8-(gauss_index_k+4)];
                    } else if (i == 2) {
                        gauss_s1_x = gauss_s1_c0[gauss_index_k+4];
                    } else if (i == 7) {
                        gauss_s1_x = gauss_s1_c1[gauss_index_k+4];
                    }

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            //float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 
            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            //float gauss_s2 = gauss_s2_precomputed[gauss_s2_index++];
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    */
    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}